

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

ssize_t __thiscall
capnp::anon_unknown_0::BrokenRequest::send
          (BrokenRequest *this,int __fd,void *__buf,size_t __n,int __flags)

{
  undefined4 in_register_00000034;
  long lVar1;
  Own<capnp::(anonymous_namespace)::BrokenPipeline> local_1d8;
  Own<capnp::PipelineHook> local_1c8;
  Pipeline local_1b8;
  Exception local_180;
  Promise<capnp::Response<capnp::AnyPointer>_> local_28;
  long local_18;
  BrokenRequest *this_local;
  
  lVar1 = CONCAT44(in_register_00000034,__fd);
  local_18 = lVar1;
  this_local = this;
  kj::cp<kj::Exception>(&local_180,(Exception *)(lVar1 + 8));
  kj::Promise<capnp::Response<capnp::AnyPointer>_>::Promise(&local_28,&local_180);
  kj::refcounted<capnp::(anonymous_namespace)::BrokenPipeline,kj::Exception&>
            ((kj *)&local_1d8,(Exception *)(lVar1 + 8));
  kj::Own<capnp::PipelineHook>::Own<capnp::(anonymous_namespace)::BrokenPipeline,void>
            (&local_1c8,&local_1d8);
  AnyPointer::Pipeline::Pipeline(&local_1b8,&local_1c8);
  RemotePromise<capnp::AnyPointer>::RemotePromise
            ((RemotePromise<capnp::AnyPointer> *)this,&local_28,&local_1b8);
  AnyPointer::Pipeline::~Pipeline(&local_1b8);
  kj::Own<capnp::PipelineHook>::~Own(&local_1c8);
  kj::Own<capnp::(anonymous_namespace)::BrokenPipeline>::~Own(&local_1d8);
  kj::Promise<capnp::Response<capnp::AnyPointer>_>::~Promise(&local_28);
  kj::Exception::~Exception(&local_180);
  return (ssize_t)this;
}

Assistant:

RemotePromise<AnyPointer> send() override {
    return RemotePromise<AnyPointer>(kj::cp(exception),
        AnyPointer::Pipeline(kj::refcounted<BrokenPipeline>(exception)));
  }